

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

bool __thiscall BaseIndex::StartBackgroundSync(BaseIndex *this)

{
  pointer pcVar1;
  size_type sVar2;
  long *plVar3;
  logic_error *this_00;
  long in_FS_OFFSET;
  thread local_38;
  long *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_init)._M_base._M_i & 1U) == 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Error: Cannot start a non-initialized index");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  else {
    pcVar1 = (this->m_name)._M_dataplus._M_p;
    sVar2 = (this->m_name)._M_string_length;
    local_38._M_id._M_thread = (id)0;
    plVar3 = (long *)operator_new(0x38);
    *plVar3 = (long)&PTR___State_impl_013b5b20;
    plVar3[1] = (long)this;
    plVar3[2] = (long)(plVar3 + 4);
    std::__cxx11::string::_M_construct<char*>((string *)(plVar3 + 2),pcVar1,pcVar1 + sVar2);
    plVar3[6] = (long)util::TraceThread;
    local_30 = plVar3;
    std::thread::_M_start_thread(&local_38,&local_30,0);
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
    if ((this->m_thread_sync)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->m_thread_sync)._M_id._M_thread = (native_handle_type)local_38._M_id._M_thread;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return true;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool BaseIndex::StartBackgroundSync()
{
    if (!m_init) throw std::logic_error("Error: Cannot start a non-initialized index");

    m_thread_sync = std::thread(&util::TraceThread, GetName(), [this] { Sync(); });
    return true;
}